

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameForDecPOMDPStage.cpp
# Opt level: O1

void __thiscall BayesianGameForDecPOMDPStage::Initialize(BayesianGameForDecPOMDPStage *this)

{
  int *piVar1;
  uint ts;
  sp_counted_base *psVar2;
  pointer puVar3;
  PlanningUnitDecPOMDPDiscrete *pPVar4;
  long lVar5;
  code *pcVar6;
  pointer ppJVar7;
  QFunctionJAOHInterface *pQVar8;
  RewardModelDiscreteInterface *pRVar9;
  _func_int *p_Var10;
  element_type *peVar11;
  long *plVar12;
  undefined1 auVar13 [8];
  void *pvVar14;
  JointBeliefInterface *jb;
  char cVar15;
  Index IVar16;
  ulong uVar17;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__x;
  uint *jaI_arr;
  size_t sVar18;
  undefined8 *puVar19;
  pointer puVar20;
  ulong uVar21;
  ulong uVar22;
  pointer puVar23;
  Index jaI;
  Index *joI_arr;
  void *pvVar24;
  undefined1 local_108 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> indTypes;
  undefined1 auStack_d8 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> firstOHtsI;
  shared_ptr<const_JointPolicyDiscretePure> local_b8;
  void *local_a0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> joI_vec;
  shared_count sStack_80;
  pointer local_78;
  JointBeliefInterface *local_70;
  undefined1 auStack_68 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> jaI_vec;
  allocator_type local_31;
  
  puVar20 = (pointer)local_108;
  ts = (this->super_BayesianGameForDecPOMDPStageInterface)._m_t;
  uVar22 = (ulong)ts;
  psVar2 = (this->super_BayesianGameForDecPOMDPStageInterface)._m_pJPol.pn.pi_;
  peVar11 = (this->super_BayesianGameForDecPOMDPStageInterface)._m_pJPol.px;
  jaI_vec.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)(this->super_BayesianGameForDecPOMDPStageInterface)._m_pJPol.pn.pi_;
  if (psVar2 != (sp_counted_base *)0x0) {
    LOCK();
    piVar1 = &psVar2->use_count_;
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  auStack_68 = (undefined1  [8])peVar11;
  boost::detail::shared_count::~shared_count((shared_count *)&jaI_vec);
  if (peVar11 == (element_type *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Warning Initialize called without past joint policy: aborting.",0x3e);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
  }
  else {
    puVar3 = (this->_m_pu->super_PlanningUnitMADPDiscrete)._m_nrJointObservationHistoriesT.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->_m_pu->super_PlanningUnitMADPDiscrete)._m_nrJointObservationHistoriesT.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar3 >> 3) <= uVar22) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar22)
      ;
    }
    local_78 = (pointer)puVar3[uVar22];
    psVar2 = (this->super_BayesianGameForDecPOMDPStageInterface)._m_pJPol.pn.pi_;
    joI_vec.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)(this->super_BayesianGameForDecPOMDPStageInterface)._m_pJPol.px;
    sStack_80.pi_ = (this->super_BayesianGameForDecPOMDPStageInterface)._m_pJPol.pn.pi_;
    if (psVar2 != (sp_counted_base *)0x0) {
      LOCK();
      piVar1 = &psVar2->use_count_;
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    auStack_68 = (undefined1  [8])0x0;
    jaI_vec.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    boost::detail::shared_count::~shared_count((shared_count *)&jaI_vec);
    auStack_d8 = (undefined1  [8])0x0;
    firstOHtsI.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    firstOHtsI.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    Fill_FirstOHtsI(this,ts,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_d8);
    if (local_78 != (pointer)0x0) {
      puVar23 = (pointer)0x0;
      uVar17 = uVar22 * 4 + 0xf & 0xfffffffffffffff0;
      puVar20 = (pointer)local_108;
      do {
        puVar20[-2] = 0x379ade;
        puVar20[-1] = 0;
        __x = BayesianGameBase::JointToIndividualTypeIndices
                        ((BayesianGameBase *)&this->super_BayesianGameIdenticalPayoff,(Index)puVar23
                        );
        puVar20[-2] = 0x379ae9;
        puVar20[-1] = 0;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_108,__x);
        joI_arr = (Index *)((long)puVar20 - uVar17);
        indTypes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = puVar20;
        joI_arr[-2] = 0x379b19;
        joI_arr[-1] = 0;
        Fill_joI_Array(this,ts,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_108,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_d8,joI_arr);
        jaI_arr = (uint *)((long)joI_arr - uVar17);
        local_b8.px = (element_type *)
                      joI_vec.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage;
        local_b8.pn.pi_ = sStack_80.pi_;
        if (sStack_80.pi_ != (sp_counted_base *)0x0) {
          LOCK();
          (sStack_80.pi_)->use_count_ = (sStack_80.pi_)->use_count_ + 1;
          UNLOCK();
        }
        jaI_arr[-2] = 0x379b58;
        jaI_arr[-1] = 0;
        Fill_jaI_Array(this,ts,joI_arr,&local_b8,jaI_arr);
        jaI_arr[-2] = 0x379b64;
        jaI_arr[-1] = 0;
        boost::detail::shared_count::~shared_count(&local_b8.pn);
        pPVar4 = this->_m_pu;
        jaI_arr[-2] = 0x379b70;
        jaI_arr[-1] = 0;
        local_70 = PlanningUnitMADPDiscrete::GetNewJointBeliefFromISD
                             (&pPVar4->super_PlanningUnitMADPDiscrete);
        if (uVar22 == 0) {
          IVar16 = 0;
          pvVar24 = (void *)0x3ff0000000000000;
        }
        else {
          jaI_arr[-2] = 0x379b9f;
          jaI_arr[-1] = 0;
          std::vector<unsigned_int,std::allocator<unsigned_int>>::vector<unsigned_int*,void>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)auStack_68,jaI_arr,
                     jaI_arr + uVar22,(allocator_type *)&local_a0);
          jaI_arr[-2] = 0x379bb6;
          jaI_arr[-1] = 0;
          std::vector<unsigned_int,std::allocator<unsigned_int>>::vector<unsigned_int*,void>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_a0,joI_arr,
                     joI_arr + uVar22,&local_31);
          pPVar4 = this->_m_pu;
          jaI_arr[-2] = 0x379bcd;
          jaI_arr[-1] = 0;
          IVar16 = PlanningUnitMADPDiscrete::GetJointActionObservationHistoryIndex
                             (&pPVar4->super_PlanningUnitMADPDiscrete,ts,
                              (vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_68,
                              (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a0);
          pPVar4 = this->_m_pu;
          jaI_arr[-4] = 0;
          jaI_arr[-3] = 0;
          jaI_arr[-2] = 0;
          jb = local_70;
          jaI_arr[-1] = 0;
          jaI_arr[-6] = 0x379bfb;
          jaI_arr[-5] = 0;
          pvVar24 = (void *)PlanningUnitMADPDiscrete::GetJAOHProbsRecursively
                                      (&pPVar4->super_PlanningUnitMADPDiscrete,jb,jaI_arr,joI_arr,0,
                                       ts,*(LIndex *)(jaI_arr + -4),
                                       *(JointPolicyDiscrete **)(jaI_arr + -2));
          pvVar14 = local_a0;
          if (local_a0 != (void *)0x0) {
            uVar21 = (long)joI_vec.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_finish - (long)local_a0;
            jaI_arr[-2] = 0x379c1f;
            jaI_arr[-1] = 0;
            operator_delete(pvVar14,uVar21);
          }
          auVar13 = auStack_68;
          if (auStack_68 != (undefined1  [8])0x0) {
            uVar21 = (long)jaI_vec.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_finish - (long)auStack_68;
            jaI_arr[-2] = 0x379c34;
            jaI_arr[-1] = 0;
            operator_delete((void *)auVar13,uVar21);
          }
        }
        if (0.0 < (double)pvVar24) {
          lVar5 = *(long *)((long)*local_70 + -0xb8);
          plVar12 = (long *)&local_70->field_0x0;
          pcVar6 = *(code **)(*(long *)((long)&local_70->field_0x0 + lVar5) + 0x78);
          jaI_arr[-2] = 0x379c70;
          jaI_arr[-1] = 0;
          cVar15 = (*pcVar6)((long)plVar12 + lVar5);
          if (cVar15 == '\0') {
            jaI_arr[-2] = 0x379e0b;
            jaI_arr[-1] = 0;
            puVar19 = (undefined8 *)__cxa_allocate_exception(0x28);
            *puVar19 = &PTR__E_0059bd80;
            puVar19[1] = puVar19 + 3;
            jaI_arr[-2] = 0x379e3b;
            jaI_arr[-1] = 0;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)(puVar19 + 1),
                       "BayesianGameForDecPOMDPStage::Initialize() joint belief not valid","");
            jaI_arr[-2] = 0x379e51;
            jaI_arr[-1] = 0;
            __cxa_throw(puVar19,&E::typeinfo,E::~E);
          }
          ppJVar7 = (this->_m_JBs).
                    super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if ((pointer)((long)(this->_m_JBs).
                              super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppJVar7 >> 3) <=
              puVar23) {
            jaI_arr[-2] = 0x379e01;
            jaI_arr[-1] = 0;
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       puVar23);
          }
          ppJVar7[(long)puVar23] = local_70;
        }
        local_a0 = pvVar24;
        if ((this->super_BayesianGameIdenticalPayoff).super_BayesianGameIdenticalPayoffInterface.
            super_BayesianGameBase._m_useSparse == true) {
          auStack_68 = (undefined1  [8])
                       &(this->super_BayesianGameIdenticalPayoff).
                        super_BayesianGameIdenticalPayoffInterface.super_BayesianGameBase.
                        _m_jTypeProbsSparse;
          jaI_vec.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = puVar23;
          jaI_arr[-2] = 0x379cd1;
          jaI_arr[-1] = 0;
          boost::numeric::ublas::
          sparse_vector_element<boost::numeric::ublas::mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
          ::set((sparse_vector_element<boost::numeric::ublas::mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
                 *)auStack_68,(value_type *)&local_a0);
        }
        else {
          (this->super_BayesianGameIdenticalPayoff).super_BayesianGameIdenticalPayoffInterface.
          super_BayesianGameBase._m_jTypeProbs.super__Vector_base<double,_std::allocator<double>_>.
          _M_impl.super__Vector_impl_data._M_start[(long)puVar23] = (double)pvVar24;
        }
        uVar21 = 0;
        while( true ) {
          jaI_arr[-2] = 0x379ce8;
          jaI_arr[-1] = 0;
          sVar18 = BayesianGameBase::GetNrJointActions
                             ((BayesianGameBase *)&this->super_BayesianGameIdenticalPayoff);
          puVar20 = indTypes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_end_of_storage;
          auVar13 = local_108;
          if (sVar18 <= uVar21) break;
          if ((double)pvVar24 <= 0.0) {
            pRVar9 = (this->super_BayesianGameIdenticalPayoff)._m_utilFunction;
            p_Var10 = (pRVar9->super_QTableInterface)._vptr_QTableInterface[1];
            jaI_arr[-2] = 0x379d3e;
            jaI_arr[-1] = 0;
            (*p_Var10)(0,pRVar9,puVar23,uVar21);
          }
          else {
            pQVar8 = this->_m_qHeuristic;
            pcVar6 = *(code **)((long)*pQVar8 + 0x68);
            jaI_arr[-2] = 0x379d12;
            jaI_arr[-1] = 0;
            (*pcVar6)(pQVar8,IVar16,uVar21);
            pRVar9 = (this->super_BayesianGameIdenticalPayoff)._m_utilFunction;
            p_Var10 = (pRVar9->super_QTableInterface)._vptr_QTableInterface[1];
            jaI_arr[-2] = 0x379d25;
            jaI_arr[-1] = 0;
            (*p_Var10)(pRVar9,puVar23,uVar21);
          }
          uVar21 = (ulong)((int)uVar21 + 1);
        }
        if (local_108 != (undefined1  [8])0x0) {
          uVar21 = (long)indTypes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish - (long)local_108;
          puVar20[-2] = 0x379d65;
          puVar20[-1] = 0;
          operator_delete((void *)auVar13,uVar21);
        }
        puVar23 = (pointer)(ulong)((Index)puVar23 + 1);
      } while (puVar23 < local_78);
    }
    auVar13 = auStack_d8;
    if (auStack_d8 != (undefined1  [8])0x0) {
      uVar22 = (long)firstOHtsI.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)auStack_d8;
      puVar20[-2] = 0x379d94;
      puVar20[-1] = 0;
      operator_delete((void *)auVar13,uVar22);
    }
    puVar20[-2] = 0x379d9d;
    puVar20[-1] = 0;
    boost::detail::shared_count::~shared_count(&sStack_80);
  }
  return;
}

Assistant:

void BayesianGameForDecPOMDPStage::Initialize()
{
    //stringstream ss;
    //ss << "GMAA::ConstructBG_ts" << depth;
    //_m_pu->StartTimer(ss.str());

    Index ts = GetStage();
    if(GetPastJointPolicy() == 0)
    {
        cerr << "Warning Initialize called without past joint policy: aborting."
            <<endl;
        return;
    }

    if(DEBUG_BG4DECPOMDP1)
        cout << ">>>BayesianGameForDecPOMDPStage::Initialize() called for"
             << " ts=" << ts << endl;
    if(DEBUG_BG4DECPOMDP2)
        cout <<" - previous policy: " << GetPastJointPolicy()->SoftPrintBrief() << endl;

    size_t nrJOHts = _m_pu->GetNrJointObservationHistories(ts);
    boost::shared_ptr<const JointPolicyDiscretePure> jpolPrevTs = GetPastJointPolicy();

    //stores the indices of the first OH for time step ts for each agent
    vector<Index> firstOHtsI;
    Fill_FirstOHtsI(ts, firstOHtsI);
    
    //the expected reward for time-steps 0...ts-1
    //this will be calculated as Sum_jaoh P(jaoh) R_{0...ts-1}(jaoh)
    //double ExpR_0_prevTS = 0.0;


    BayesianGameIdenticalPayoff *bg_ts=this;
    //for each joint obs. history (type of the BG), we determine the actions
    //that jpolPrevTs would have specified (i.e., we determine JAOH, the 
    //act-obs. history). This is then used to compute:
    //  -the probability of this joint obs. history (given jpolPrevTs)
    //  -the expected reward over 0...ts-1 GIVEN that this JAOH occurs
    for(Index jtI = 0; jtI < nrJOHts; jtI++)
    {
        if(DEBUG_BG4DECPOMDP2)
            PrintProgress("jtI",jtI,nrJOHts, 10);
        
        //we loop over Joint Type indices - these correspond to 
        //joint observation history indices, but non-trivially, so let's first
        //compute the joint observation history 
        const vector<Index> indTypes = bg_ts->JointToIndividualTypeIndices(jtI);

        //array for the joint observations at ts=1,...,ts
        Index joI_arr[ts];
        Fill_joI_Array(ts, indTypes, firstOHtsI, joI_arr);

        //we don't want to be dependent on the generation of joint
        //observation histories
        //const JointObservationHistoryTree* joht = Get_joht(ts, joI_arr);
        //Index johI = _m_pu->GetJointObservationHistoryIndex(ts, joI_arr);

        //see what joint action-observation history corresponds to 
        // previous policy jpolPrevTs

        //first get all actions taken
        Index jaI_arr[ts];//the taken joint actions at t=0,...,ts-1
        Fill_jaI_Array(ts, joI_arr, jpolPrevTs, jaI_arr);
        //now we know the taken actions and the observation history, so we 
        //can reconstruct the joint action-observation history and its 
        //probability.

        //the cumulative reward over 0...ts-1 GIVEN that this JAOH occurs.
        //double ExpR_0_prevTS_thisJAOH = 0.0;
        //get the joah Index and corresponding reward and prob.
        //new:
        Index jaohI = 0;
        double PjaohI = 1.0;
        JointBeliefInterface* jb = _m_pu->GetNewJointBeliefFromISD();
        if(ts > 0)
        {
            vector< Index > jaI_vec(&jaI_arr[0],&jaI_arr[ts]);
            vector< Index > joI_vec(&joI_arr[0],&joI_arr[ts]);
            jaohI = _m_pu->GetJointActionObservationHistoryIndex(ts, jaI_vec, 
                    joI_vec);
            PjaohI = _m_pu->GetJAOHProbsRecursively(jb, jaI_arr, joI_arr, 0,ts);
        }
        if(PjaohI>0)
        {
            if(jb->SanityCheck())
                _m_JBs.at(jtI) = jb;
            else
                throw(E("BayesianGameForDecPOMDPStage::Initialize() joint belief not valid"));
        }

/*        //old:
        ProbRewardForjoahI(ts, jtI, jaI_arr,joI_arr, jaohI, PjaohI, 
              ExpR_0_prevTS_thisJAOH );
        ExpR_0_prevTS += ExpR_0_prevTS_thisJAOH * PjaohI;
*/

        //now we have found the jaohI corresponding to johI (jtI) and 
        //previous policy jpolPrevTs, so we can get the Q-value and prob. for 
        //the BG.
        bg_ts->SetProbability(jtI, PjaohI);
        for(Index jaI=0; jaI < GetNrJointActions(); jaI++)
        {
            if(PjaohI>0) // asking for a heuristic Q for a history
                         // that cannot have occurred might lead to
                         // problems (QMDP cannot compute a belief for
                         // instance, so just put 0
            {
                double ut = _m_qHeuristic->GetQ(jaohI, jaI);
                bg_ts->SetUtility(jtI, jaI, ut );
            }
            else
                bg_ts->SetUtility(jtI, jaI, 0);
        }
    
    }//end for jtI
    //now the Bayesian game is constructed completely.

    //perhaps store the previous reward somewhere?
    //_m_pastReward = ExpR_0_prevTS;
}